

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatFile.cpp
# Opt level: O0

DatFile * __thiscall DatUnpacker::DatFile::operator>>(DatFile *this,int *value)

{
  DatFile *pDVar1;
  int *value_local;
  DatFile *this_local;
  
  pDVar1 = operator>>(this,(uint *)value);
  return pDVar1;
}

Assistant:

DatFile& DatFile::operator>>(int &value)
    {
        return operator>>((unsigned int&)value);
    }